

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isMemberQualifier(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if ((((kind == ConstKeyword) || (kind == ExternKeyword)) || (kind == LocalKeyword)) ||
     (((kind == ProtectedKeyword || ((ushort)(kind - PureKeyword) < 3)) ||
      ((kind == StaticKeyword || (kind == VirtualKeyword)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isMemberQualifier(TokenKind kind) {
    switch (kind) {
        case TokenKind::ConstKeyword:
        case TokenKind::RandKeyword:
        case TokenKind::RandCKeyword:
        case TokenKind::PureKeyword:
        case TokenKind::VirtualKeyword:
        case TokenKind::ExternKeyword:
        case TokenKind::StaticKeyword:
        case TokenKind::LocalKeyword:
        case TokenKind::ProtectedKeyword:
            return true;
        default:
            return false;
    }
}